

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comparators.cpp
# Opt level: O0

int duckdb::Comparators::TemplatedCompareVal<float>(data_ptr_t *left_ptr,data_ptr_t *right_ptr)

{
  bool bVar1;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  float fVar2;
  float fVar3;
  float right_val;
  float left_val;
  float *in_stack_ffffffffffffffd8;
  undefined4 local_4;
  
  fVar2 = Load<float>((const_data_ptr_t)*in_RDI);
  fVar3 = Load<float>((const_data_ptr_t)*in_RSI);
  bVar1 = duckdb::Equals::Operation<float>((float *)CONCAT44(fVar2,fVar3),in_stack_ffffffffffffffd8)
  ;
  if (bVar1) {
    local_4 = 0;
  }
  else {
    bVar1 = LessThan::Operation<float>((float *)CONCAT44(fVar2,fVar3),in_stack_ffffffffffffffd8);
    if (bVar1) {
      local_4 = -1;
    }
    else {
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

int Comparators::TemplatedCompareVal(const data_ptr_t &left_ptr, const data_ptr_t &right_ptr) {
	const auto left_val = Load<T>(left_ptr);
	const auto right_val = Load<T>(right_ptr);
	if (Equals::Operation<T>(left_val, right_val)) {
		return 0;
	} else if (LessThan::Operation<T>(left_val, right_val)) {
		return -1;
	} else {
		return 1;
	}
}